

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonArray.cpp
# Opt level: O1

bool __thiscall Json::JsonArray::put(JsonArray *this,JsonValue *jsonValue)

{
  pointer psVar1;
  pointer psVar2;
  pointer psVar3;
  long lVar4;
  shared_ptr<Json::JsonValue> local_20;
  
  if (jsonValue != (JsonValue *)0x0) {
    psVar3 = (this->__lstJsonArray).
             super__Vector_base<std::shared_ptr<Json::JsonValue>,_std::allocator<std::shared_ptr<Json::JsonValue>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (this->__lstJsonArray).
             super__Vector_base<std::shared_ptr<Json::JsonValue>,_std::allocator<std::shared_ptr<Json::JsonValue>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    psVar2 = psVar1;
    if ((long)psVar1 - (long)psVar3 != 0) {
      lVar4 = (long)psVar1 - (long)psVar3 >> 4;
      lVar4 = lVar4 + (ulong)(lVar4 == 0);
      do {
        psVar2 = psVar3;
        if ((psVar3->super___shared_ptr<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
            jsonValue) break;
        psVar3 = psVar3 + 1;
        lVar4 = lVar4 + -1;
        psVar2 = psVar1;
      } while (lVar4 != 0);
    }
    if (psVar2 == (this->__lstJsonArray).
                  super__Vector_base<std::shared_ptr<Json::JsonValue>,_std::allocator<std::shared_ptr<Json::JsonValue>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      (*jsonValue->_vptr_JsonValue[6])
                (jsonValue,(ulong)(byte)(this->super_JsonFormatter).field_0x26);
      local_20.super___shared_ptr<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr = jsonValue;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Json::JsonValue*>
                (&local_20.super___shared_ptr<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,jsonValue);
      std::vector<std::shared_ptr<Json::JsonValue>,std::allocator<std::shared_ptr<Json::JsonValue>>>
      ::emplace_back<std::shared_ptr<Json::JsonValue>>
                ((vector<std::shared_ptr<Json::JsonValue>,std::allocator<std::shared_ptr<Json::JsonValue>>>
                  *)&this->__lstJsonArray,&local_20);
      if (local_20.super___shared_ptr<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_20.super___shared_ptr<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool Json::JsonArray::put(JsonValue *jsonValue) {
    if (!jsonValue) return false;
    if (find(jsonValue) != __lstJsonArray.end())return false;
    jsonValue->setEscapeChar(__escape);
    __lstJsonArray.push_back(std::shared_ptr<JsonValue>(jsonValue));
    return true;
}